

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineTestRunnerTest.cpp
# Opt level: O2

void __thiscall
TEST_CommandLineTestRunner_testsCanBeRunInReverseOrder_Test::testBody
          (TEST_CommandLineTestRunner_testsCanBeRunInReverseOrder_Test *this)

{
  TestRegistry *this_00;
  UtestShell *pUVar1;
  SimpleString *pSVar2;
  char *pcVar3;
  SimpleString local_a0;
  SimpleStringCollection stringCollection;
  CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner;
  char *argv [3];
  
  argv[2] = "-b";
  argv[0] = "tests.exe";
  argv[1] = "-v";
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).registry;
  TestRegistry::addTest(this_00,(this->super_TEST_GROUP_CppUTestGroupCommandLineTestRunner).test2);
  CommandLineTestRunnerWithStringBufferOutput::CommandLineTestRunnerWithStringBufferOutput
            (&commandLineTestRunner,3,argv,this_00);
  CommandLineTestRunner::runAllTestsMain(&commandLineTestRunner.super_CommandLineTestRunner);
  SimpleStringCollection::SimpleStringCollection(&stringCollection);
  SimpleString::SimpleString(&local_a0,"\n");
  SimpleString::split(&(commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer)->output,
                      &local_a0,&stringCollection);
  SimpleString::~SimpleString(&local_a0);
  pUVar1 = UtestShell::getCurrent();
  pSVar2 = SimpleStringCollection::operator[](&stringCollection,0);
  pcVar3 = SimpleString::asCharString(pSVar2);
  (*pUVar1->_vptr_UtestShell[0xc])
            (pUVar1,"test1",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0xf7);
  pUVar1 = UtestShell::getCurrent();
  pSVar2 = SimpleStringCollection::operator[](&stringCollection,1);
  pcVar3 = SimpleString::asCharString(pSVar2);
  (*pUVar1->_vptr_UtestShell[0xc])
            (pUVar1,"test2",pcVar3,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineTestRunnerTest.cpp"
             ,0xf8);
  SimpleStringCollection::~SimpleStringCollection(&stringCollection);
  CommandLineTestRunner::~CommandLineTestRunner(&commandLineTestRunner.super_CommandLineTestRunner);
  return;
}

Assistant:

TEST(CommandLineTestRunner, testsCanBeRunInReverseOrder)
{
    const char* argv[] = { "tests.exe", "-v", "-b"};

    registry.addTest(test2);
    CommandLineTestRunnerWithStringBufferOutput commandLineTestRunner(3, argv, &registry);
    commandLineTestRunner.runAllTestsMain();

    SimpleStringCollection stringCollection;
    commandLineTestRunner.fakeConsoleOutputWhichIsReallyABuffer->getOutput().split("\n", stringCollection);
    STRCMP_CONTAINS("test1", stringCollection[0].asCharString());
    STRCMP_CONTAINS("test2", stringCollection[1].asCharString());
}